

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression * build_ir_assign(Context_conflict *ctx,MOJOSHADER_astExpressionBinary *ast)

{
  MOJOSHADER_astDataTypeType MVar1;
  int iVar2;
  int iVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_irExpression *pMVar5;
  MOJOSHADER_irExpression *dst;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *next;
  uint in_ECX;
  
  pMVar4 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->left);
  if (pMVar4 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar4->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) goto LAB_00146fa4;
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar4->ir).type) goto LAB_00146fc3;
  }
  pMVar5 = (MOJOSHADER_irExpression *)build_ir(ctx,ast->right);
  if (pMVar5 != (MOJOSHADER_irExpression *)0x0) {
    if ((pMVar5->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
LAB_00146fa4:
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar5->ir).type) {
LAB_00146fc3:
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
  }
  MVar1 = (pMVar4->info).type;
  iVar2 = (pMVar4->info).elements;
  iVar3 = ctx->ir_temp_count;
  ctx->ir_temp_count = iVar3 + 1;
  if (MVar1 != (pMVar5->info).type) {
    __assert_fail("type == rvalue->info.type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1523,
                  "MOJOSHADER_irExpression *build_ir_assign(Context *, const MOJOSHADER_astExpressionBinary *)"
                 );
  }
  if (iVar2 == (pMVar5->info).elements) {
    dst = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (dst == (MOJOSHADER_irExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      dst = (MOJOSHADER_irExpression *)0x0;
    }
    else {
      (dst->ir).type = MOJOSHADER_IR_TEMP;
      (dst->ir).filename = ctx->sourcefile;
      in_ECX = ctx->sourceline;
      (dst->ir).line = in_ECX;
      (dst->info).type = MVar1;
      (dst->info).elements = iVar2;
      (dst->temp).index = iVar3;
    }
    pMVar6 = new_ir_move(ctx,dst,pMVar5,in_ECX);
    pMVar5 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar5 == (MOJOSHADER_irExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar5 = (MOJOSHADER_irExpression *)0x0;
    }
    else {
      (pMVar5->ir).type = MOJOSHADER_IR_TEMP;
      (pMVar5->ir).filename = ctx->sourcefile;
      in_ECX = ctx->sourceline;
      (pMVar5->ir).line = in_ECX;
      (pMVar5->info).type = MVar1;
      (pMVar5->info).elements = iVar2;
      (pMVar5->temp).index = iVar3;
    }
    next = new_ir_move(ctx,pMVar4,pMVar5,in_ECX);
    pMVar6 = new_ir_seq(ctx,pMVar6,next);
    pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar4 = (MOJOSHADER_irExpression *)0x0;
    }
    else {
      (pMVar4->ir).type = MOJOSHADER_IR_TEMP;
      (pMVar4->ir).filename = ctx->sourcefile;
      (pMVar4->ir).line = ctx->sourceline;
      (pMVar4->info).type = MVar1;
      (pMVar4->info).elements = iVar2;
      (pMVar4->temp).index = iVar3;
    }
    pMVar4 = new_ir_eseq(ctx,pMVar6,pMVar4);
    return pMVar4;
  }
  __assert_fail("elems == rvalue->info.elements",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1524,
                "MOJOSHADER_irExpression *build_ir_assign(Context *, const MOJOSHADER_astExpressionBinary *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_assign(Context *ctx,
                                                const MOJOSHADER_astExpressionBinary *ast)
{
    MOJOSHADER_irExpression *lvalue = build_ir_expr(ctx, ast->left);
    MOJOSHADER_irExpression *rvalue = build_ir_expr(ctx, ast->right);
    const MOJOSHADER_astDataTypeType type = lvalue->info.type;
    const int elems = lvalue->info.elements;
    const int tmp = generate_ir_temp(ctx);

    // Semantic analysis should have inserted casts if necessary.
    assert(type == rvalue->info.type);
    assert(elems == rvalue->info.elements);

    // !!! FIXME: write masking!
    // !!! FIXME: whole array/struct assignments need to become a sequence of moves.
    return new_ir_eseq(ctx,
                new_ir_seq(ctx,
                    new_ir_move(ctx, new_ir_temp(ctx, tmp, type, elems), rvalue, -1),
                    new_ir_move(ctx, lvalue, new_ir_temp(ctx, tmp, type, elems), -1)),
                new_ir_temp(ctx, tmp, type, elems));
}